

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagepattern.cpp
# Opt level: O1

int32_t icu_63::MessagePattern::parseArgNumber(UnicodeString *s,int32_t start,int32_t limit)

{
  ushort uVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  char16_t *pcVar5;
  uint uVar6;
  int32_t iVar7;
  uint uVar8;
  char16_t cVar9;
  
  iVar4 = -2;
  if (start < limit) {
    uVar1 = (s->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      uVar6 = *(uint *)((long)&s->fUnion + 4);
    }
    else {
      uVar6 = (int)(short)uVar1 >> 5;
    }
    cVar9 = L'\xffff';
    if ((uint)start < uVar6) {
      if ((uVar1 & 2) == 0) {
        pcVar5 = (s->fUnion).fFields.fArray;
      }
      else {
        pcVar5 = (char16_t *)((long)&s->fUnion + 2);
      }
      cVar9 = pcVar5[start];
    }
    uVar8 = start + 1;
    if (cVar9 == L'0') {
      bVar3 = true;
      bVar2 = true;
      iVar4 = 0;
      if (uVar8 != limit) {
LAB_002912ed:
        if ((int)uVar8 < limit) {
          if ((uVar1 & 2) == 0) {
            pcVar5 = (s->fUnion).fFields.fArray;
          }
          else {
            pcVar5 = (char16_t *)((long)&s->fUnion + 2);
          }
          pcVar5 = pcVar5 + (int)uVar8;
          bVar2 = bVar3;
          do {
            cVar9 = L'\xffff';
            if (uVar8 < uVar6) {
              cVar9 = *pcVar5;
            }
            if (9 < (ushort)(cVar9 + L'￐')) {
              return -1;
            }
            if (0xccccccb < iVar4) {
              bVar2 = true;
            }
            iVar4 = (uint)(ushort)cVar9 + iVar4 * 10 + -0x30;
            uVar8 = uVar8 + 1;
            pcVar5 = pcVar5 + 1;
          } while (limit != uVar8);
        }
        iVar7 = -2;
        if (!bVar2) {
          iVar7 = iVar4;
        }
        return iVar7;
      }
    }
    else {
      iVar4 = -1;
      if ((ushort)(cVar9 + L'ￏ') < 9) {
        iVar4 = (ushort)cVar9 - 0x30;
        bVar3 = false;
        bVar2 = false;
        goto LAB_002912ed;
      }
    }
  }
  return iVar4;
}

Assistant:

int32_t
MessagePattern::parseArgNumber(const UnicodeString &s, int32_t start, int32_t limit) {
    // If the identifier contains only ASCII digits, then it is an argument _number_
    // and must not have leading zeros (except "0" itself).
    // Otherwise it is an argument _name_.
    if(start>=limit) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    }
    int32_t number;
    // Defer numeric errors until we know there are only digits.
    UBool badNumber;
    UChar c=s.charAt(start++);
    if(c==0x30) {
        if(start==limit) {
            return 0;
        } else {
            number=0;
            badNumber=TRUE;  // leading zero
        }
    } else if(0x31<=c && c<=0x39) {
        number=c-0x30;
        badNumber=FALSE;
    } else {
        return UMSGPAT_ARG_NAME_NOT_NUMBER;
    }
    while(start<limit) {
        c=s.charAt(start++);
        if(0x30<=c && c<=0x39) {
            if(number>=INT32_MAX/10) {
                badNumber=TRUE;  // overflow
            }
            number=number*10+(c-0x30);
        } else {
            return UMSGPAT_ARG_NAME_NOT_NUMBER;
        }
    }
    // There are only ASCII digits.
    if(badNumber) {
        return UMSGPAT_ARG_NAME_NOT_VALID;
    } else {
        return number;
    }
}